

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_christmas_event.hpp
# Opt level: O3

void __thiscall PatchChristmasEvent::load_from_rom(PatchChristmasEvent *this,ROM *rom)

{
  pointer puVar1;
  pointer puVar2;
  pointer pSVar3;
  pointer pSVar4;
  pointer in_stack_ffffffffffffffa8;
  void *pvVar5;
  pointer puStack_50;
  pointer local_48;
  pointer pSStack_40;
  pointer local_38;
  pointer pSStack_30;
  Color local_28 [2];
  Color aCStack_20 [2];
  
  ColorPalette<16UL>::from_rom((ColorPalette<16UL> *)&stack0xffffffffffffffa8,rom,0x3deca);
  *(Color (*) [2])((this->_title_palette).super_array<Color,_16UL>._M_elems + 0xc) = local_28;
  *(Color (*) [2])((this->_title_palette).super_array<Color,_16UL>._M_elems + 0xe) = aCStack_20;
  *(pointer *)((this->_title_palette).super_array<Color,_16UL>._M_elems + 8) = local_38;
  *(pointer *)((this->_title_palette).super_array<Color,_16UL>._M_elems + 10) = pSStack_30;
  *(pointer *)((this->_title_palette).super_array<Color,_16UL>._M_elems + 4) = local_48;
  *(pointer *)((this->_title_palette).super_array<Color,_16UL>._M_elems + 6) = pSStack_40;
  *(pointer *)(this->_title_palette).super_array<Color,_16UL>._M_elems = in_stack_ffffffffffffffa8;
  *(pointer *)((this->_title_palette).super_array<Color,_16UL>._M_elems + 2) = puStack_50;
  Sprite::decode_from(in_stack_ffffffffffffffa8);
  puVar1 = (this->_moneybag_sprite)._data.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->_moneybag_sprite)._data.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->_moneybag_sprite)._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = in_stack_ffffffffffffffa8;
  (this->_moneybag_sprite)._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = puStack_50;
  (this->_moneybag_sprite)._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_48;
  pvVar5 = (void *)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)puVar2 - (long)puVar1);
  }
  pSVar3 = (this->_moneybag_sprite)._subsprites.
           super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar4 = (this->_moneybag_sprite)._subsprites.
           super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->_moneybag_sprite)._subsprites.
  super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
  super__Vector_impl_data._M_start = pSStack_40;
  (this->_moneybag_sprite)._subsprites.
  super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
  super__Vector_impl_data._M_finish = local_38;
  (this->_moneybag_sprite)._subsprites.
  super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pSStack_30;
  if (pSVar3 != (pointer)0x0) {
    operator_delete(pSVar3,(long)pSVar4 - (long)pSVar3);
  }
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,-(long)pvVar5);
  }
  return;
}

Assistant:

void load_from_rom(const md::ROM& rom) override
    {
        _title_palette = ColorPalette<16>::from_rom(rom, 0x3DECA);

        constexpr uint32_t MONEYBAG_SPRITE_ADDR = 0x151CC4;
        _moneybag_sprite = Sprite::decode_from(rom.iterator_at(MONEYBAG_SPRITE_ADDR));
    }